

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

ags_t AGSSock::Socket_SendDataTo(Socket *sock,SockAddr *addr,SockData *data)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  pointer __buf;
  ulong uVar4;
  size_type __n;
  
  __n = (data->data)._M_string_length;
  if (__n == 0) {
    uVar4 = 1;
  }
  else {
    __buf = (data->data)._M_dataplus._M_p;
    do {
      sVar1 = sendto(sock->id,__buf,__n,0,(sockaddr *)addr,0x80);
      if (sVar1 == -1) break;
      __buf = __buf + sVar1;
      __n = __n - sVar1;
    } while (__n != 0);
    uVar4 = (ulong)(sVar1 != -1);
  }
  piVar2 = __errno_location();
  iVar3 = 0;
  if (*piVar2 != 0xb) {
    iVar3 = *piVar2;
  }
  sock->error = iVar3;
  return uVar4;
}

Assistant:

ags_t Socket_SendDataTo(Socket *sock, const SockAddr *addr, const SockData *data)
{
	return sendto_impl(sock, addr, data->data.data(), data->data.size());
}